

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O0

void pnga_msg_pgroup_sync(Integer grp_id)

{
  int in_EDI;
  int p_grp;
  
  if (in_EDI < 1) {
    armci_msg_barrier();
  }
  else {
    armci_msg_group_barrier((ARMCI_Group *)0x201298);
  }
  return;
}

Assistant:

void pnga_msg_pgroup_sync(Integer grp_id)
{
    int p_grp = (int)(grp_id);
    if(p_grp>0) {
#     ifdef MSG_COMMS_MPI       
        armci_msg_group_barrier(&(PGRP_LIST[p_grp].group));
#     else
        pnga_error("ga_msg_pgroup_sync not implemented",0);
#     endif
    }
    else {
#     if defined(MSG_COMMS_MPI)
       armci_msg_barrier();
#     else
       tcg_synch(GA_TYPE_SYN);
#    endif
    }
}